

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UChar32 ucase_toupper_63(UChar32 c)

{
  ushort uVar1;
  ushort uVar2;
  undefined2 *puVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  uint local_28;
  int32_t delta;
  uint16_t excWord;
  uint16_t *pe;
  uint local_10;
  uint16_t props;
  UChar32 c_local;
  
  uVar4 = c >> 5;
  if ((uint)c < 0xd800) {
    local_34 = (uint)ucase_props_trieIndex[(int)uVar4] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar5 = 0;
      if (c < 0xdc00) {
        iVar5 = 0x140;
      }
      local_38 = (uint)ucase_props_trieIndex[(int)(iVar5 + uVar4)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_40 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar4 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_40 = 0x2f1c;
        }
        local_3c = local_40;
      }
      else {
        local_3c = 0xd30;
      }
      local_38 = local_3c;
    }
    local_34 = local_38;
  }
  uVar1 = ucase_props_trieIndex[local_34];
  local_10 = c;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 3) == 1) {
      local_10 = ((int)(short)uVar1 >> 7) + c;
    }
  }
  else {
    lVar6 = (long)((int)(uint)uVar1 >> 4) * 2 + 0x27ae12;
    uVar2 = ucase_props_exceptions[(int)(uint)uVar1 >> 4];
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 3) == 1)) {
      if ((uVar2 & 0x100) == 0) {
        local_28 = (uint)*(ushort *)(lVar6 + (long)(int)(uint)""[(int)(uVar2 & 0xf)] * 2);
      }
      else {
        puVar3 = (undefined2 *)(lVar6 + (long)(int)((uint)""[(int)(uVar2 & 0xf)] << 1) * 2);
        local_28 = CONCAT22(*puVar3,puVar3[1]);
      }
      if ((uVar2 & 0x400) != 0) {
        local_28 = -local_28;
      }
      local_44 = c + local_28;
      return local_44;
    }
    if ((uVar2 & 4) != 0) {
      if ((uVar2 & 0x100) == 0) {
        local_10 = (uint)*(ushort *)(lVar6 + (long)(int)(uint)""[(int)(uVar2 & 3)] * 2);
      }
      else {
        puVar3 = (undefined2 *)(lVar6 + (long)(int)((uint)""[(int)(uVar2 & 3)] << 1) * 2);
        local_10 = CONCAT22(*puVar3,puVar3[1]);
      }
    }
  }
  return local_10;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucase_toupper(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_GET_TYPE(props)==UCASE_LOWER) {
            c+=UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        uint16_t excWord=*pe++;
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_GET_TYPE(props)==UCASE_LOWER) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_UPPER)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_UPPER, pe, c);
        }
    }
    return c;
}